

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::Initialize
          (TPZBlockDiagonal<std::complex<double>_> *this,TPZVec<int> *blocksize)

{
  int64_t newsize;
  int *piVar1;
  long *plVar2;
  long lVar3;
  TPZVec<std::complex<double>_> *in_RSI;
  long in_RDI;
  int bsize;
  int64_t neq;
  int64_t ndata;
  int64_t b;
  int64_t nblock;
  TPZVec<int> *in_stack_ffffffffffffff88;
  TPZVec<int> *in_stack_ffffffffffffff90;
  long *in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  TPZVec<long> *in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  complex<double> *copy;
  TPZVec<std::complex<double>_> *this_00;
  int64_t local_28;
  complex<double> *object;
  
  newsize = TPZVec<int>::NElements((TPZVec<int> *)in_RSI);
  TPZVec<int>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  object = (complex<double> *)0x0;
  TPZVec<long>::Resize
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  this_00 = (TPZVec<std::complex<double>_> *)0x0;
  copy = (complex<double> *)0x0;
  for (local_28 = 0; local_28 < newsize; local_28 = local_28 + 1) {
    piVar1 = TPZVec<int>::operator[]((TPZVec<int> *)in_RSI,local_28);
    in_stack_ffffffffffffffc4 = *piVar1;
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_28);
    lVar3 = *plVar2 + (long)(in_stack_ffffffffffffffc4 * in_stack_ffffffffffffffc4);
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_28 + 1);
    *plVar2 = lVar3;
    this_00 = (TPZVec<std::complex<double>_> *)
              ((long)&this_00->_vptr_TPZVec +
              (long)(in_stack_ffffffffffffffc4 * in_stack_ffffffffffffffc4));
    copy = (complex<double> *)(copy->_M_value + in_stack_ffffffffffffffc4);
  }
  std::complex<double>::complex((complex<double> *)&stack0xffffffffffffffb0,0.0,0.0);
  TPZVec<std::complex<double>_>::Fill
            (this_00,copy,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  std::complex<double>::complex((complex<double> *)&stack0xffffffffffffffa0,0.0,0.0);
  TPZVec<std::complex<double>_>::Resize(in_RSI,newsize,object);
  *(undefined1 *)(in_RDI + 0x18) = 0;
  *(complex<double> **)(in_RDI + 8) = copy;
  *(complex<double> **)(in_RDI + 0x10) = copy;
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Initialize(const TPZVec<int> &blocksize){
	int64_t nblock = blocksize.NElements();
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Number of blocks \t" << nblock;
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	fBlockSize = blocksize;
	fBlockPos.Resize(nblock+1,0); 
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksize[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
#ifdef PZ_LOG
	if(ndata > 10000000)
	{
		std::stringstream sout;
		sout << "Calling fStorage.Resize(ndata,0.) with ndata = " << ndata;
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	
	fStorage.Fill(0.,0);
	fStorage.Resize(ndata,0.);
	this->fDecomposed = 0;
	this->fRow = neq;
	this->fCol = neq;
}